

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetConfidentialTxIn
              (void *handle,char *tx_hex_string,uint32_t index,char **txid,uint32_t *vout,
              uint32_t *sequence,char **script_sig)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 *in_RCX;
  uint32_t in_EDX;
  char *in_RSI;
  uint32_t *in_R8;
  uint32_t *in_R9;
  undefined8 *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  ConfidentialTxInReference ref;
  ConfidentialTransaction *tx;
  ConfidentialTransactionController ctxc;
  char *work_script_sig;
  char *work_txid;
  AbstractTxInReference *in_stack_fffffffffffffc88;
  ConfidentialTxInReference *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined8 in_stack_fffffffffffffca8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcf0;
  string local_2d8;
  Txid local_2b8;
  string local_298;
  ConfidentialTxInReference local_278;
  ConfidentialTransaction *local_118;
  allocator local_109;
  string local_108 [32];
  ConfidentialTransactionController local_e8;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  CfdSourceLocation local_70;
  char *local_48;
  char *local_40;
  uint32_t *local_38;
  uint32_t *local_30;
  undefined8 *local_28;
  uint32_t local_1c;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,local_18,&local_109);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              ((ConfidentialTransactionController *)
               CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    local_118 = cfd::ConfidentialTransactionController::GetTransaction(&local_e8);
    cfd::core::ConfidentialTransaction::GetTxIn(&local_278,local_118,local_1c);
    if (local_28 != (undefined8 *)0x0) {
      cfd::core::AbstractTxInReference::GetTxid(in_stack_fffffffffffffc88);
      cfd::core::Txid::GetHex_abi_cxx11_(&local_298,&local_2b8);
      local_40 = cfd::capi::CreateString(in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string((string *)&local_298);
      cfd::core::Txid::~Txid((Txid *)0x5a6623);
    }
    if (local_30 != (uint32_t *)0x0) {
      uVar2 = cfd::core::AbstractTxInReference::GetVout(&local_278.super_AbstractTxInReference);
      *local_30 = uVar2;
    }
    if (local_38 != (uint32_t *)0x0) {
      uVar2 = cfd::core::AbstractTxInReference::GetSequence(&local_278.super_AbstractTxInReference);
      *local_38 = uVar2;
    }
    if (in_stack_00000008 != (undefined8 *)0x0) {
      cfd::core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffc88);
      cfd::core::Script::GetHex_abi_cxx11_(&local_2d8,(Script *)&stack0xfffffffffffffcf0);
      local_48 = cfd::capi::CreateString(in_stack_fffffffffffffcf0);
      std::__cxx11::string::~string((string *)&local_2d8);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffffc90);
    }
    if (local_40 != (char *)0x0) {
      *local_28 = local_40;
    }
    if (local_48 != (char *)0x0) {
      *in_stack_00000008 = local_48;
    }
    local_4 = 0;
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffc90);
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController
              ((ConfidentialTransactionController *)in_stack_fffffffffffffc90);
    return local_4;
  }
  local_70.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_70.filename = local_70.filename + 1;
  local_70.line = 0x1cc;
  local_70.funcname = "CfdGetConfidentialTxIn";
  cfd::core::logger::warn<>(&local_70,"tx is null or empty.");
  local_92 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Failed to parameter. tx is null or empty.",&local_91);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffcb0,error_code,
             (string *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
  local_92 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxIn(
    void* handle, const char* tx_hex_string, uint32_t index, char** txid,
    uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();
    const ConfidentialTxInReference ref = tx.GetTxIn(index);

    if (txid != nullptr) {
      work_txid = CreateString(ref.GetTxid().GetHex());
    }
    if (vout != nullptr) {
      *vout = ref.GetVout();
    }
    if (sequence != nullptr) {
      *sequence = ref.GetSequence();
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(ref.GetUnlockingScript().GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}